

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O0

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::removeRow(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *lp,int i)

{
  int iVar1;
  int *piVar2;
  int in_EDX;
  long *in_RSI;
  long in_RDI;
  
  iVar1 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x71e5c0);
  piVar2 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x1f8),iVar1 + -1);
  iVar1 = *piVar2;
  piVar2 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x1f8),in_EDX);
  *piVar2 = iVar1;
  (**(code **)(*in_RSI + 0x78))(in_RSI,in_EDX);
  return;
}

Assistant:

void removeRow(SPxLPBase<R>& lp, int i)
   {
      m_rIdx[i] = m_rIdx[lp.nRows() - 1];
      lp.removeRow(i);
   }